

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::_copy(Tree *this,Tree *that)

{
  code *pcVar1;
  substr next_arena;
  bool bVar2;
  error_flags eVar3;
  long lVar4;
  undefined8 *in_RSI;
  long *in_RDI;
  size_t i;
  substr arena;
  char msg_3 [37];
  char msg_2 [33];
  char msg_1 [39];
  char msg [33];
  size_t in_stack_000001e8;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  char *in_stack_fffffffffffffe38;
  Location *in_stack_fffffffffffffe40;
  Location *this_00;
  ulong local_178;
  basic_substring<char> local_160 [3];
  Location local_128;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 local_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  char *local_e0;
  undefined1 local_d8 [48];
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined4 local_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  char *local_90;
  undefined1 local_88 [48];
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  char *local_40;
  undefined1 local_38 [40];
  undefined8 *local_10;
  
  local_10 = in_RSI;
  if (*in_RDI != 0) {
    memcpy(local_38,"check failed: (m_buf == nullptr)",0x21);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = (code *)in_RDI[0xb];
    Location::Location(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                       CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                       CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    (*pcVar1)(local_38,0x21,in_RDI[8]);
    in_stack_fffffffffffffe20 = uStack_58;
    in_stack_fffffffffffffe24 = uStack_54;
    in_stack_fffffffffffffe28 = local_50;
    in_stack_fffffffffffffe2c = uStack_4c;
    in_stack_fffffffffffffe30 = uStack_48;
    in_stack_fffffffffffffe34 = uStack_44;
    in_stack_fffffffffffffe38 = local_40;
  }
  if (in_RDI[5] != 0) {
    memcpy(local_88,"check failed: (m_arena.str == nullptr)",0x27);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = (code *)in_RDI[0xb];
    Location::Location(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                       CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                       CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    (*pcVar1)(local_88,0x27,in_RDI[8]);
    in_stack_fffffffffffffe20 = uStack_a8;
    in_stack_fffffffffffffe24 = uStack_a4;
    in_stack_fffffffffffffe28 = local_a0;
    in_stack_fffffffffffffe2c = uStack_9c;
    in_stack_fffffffffffffe30 = uStack_98;
    in_stack_fffffffffffffe34 = uStack_94;
    in_stack_fffffffffffffe38 = local_90;
  }
  if (in_RDI[6] != 0) {
    memcpy(local_d8,"check failed: (m_arena.len == 0)",0x21);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = (code *)in_RDI[0xb];
    Location::Location(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                       CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                       CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    (*pcVar1)(local_d8,0x21,in_RDI[8]);
    in_stack_fffffffffffffe20 = uStack_f8;
    in_stack_fffffffffffffe24 = uStack_f4;
    in_stack_fffffffffffffe28 = local_f0;
    in_stack_fffffffffffffe2c = uStack_ec;
    in_stack_fffffffffffffe30 = uStack_e8;
    in_stack_fffffffffffffe34 = uStack_e4;
    in_stack_fffffffffffffe38 = local_e0;
  }
  lVar4 = (*(code *)in_RDI[9])(local_10[1] * 0x90,*local_10,in_RDI[8]);
  *in_RDI = lVar4;
  memcpy((void *)*in_RDI,(void *)*local_10,local_10[1] * 0x90);
  in_RDI[1] = local_10[1];
  in_RDI[2] = local_10[2];
  in_RDI[3] = local_10[3];
  in_RDI[4] = local_10[4];
  in_RDI[7] = local_10[7];
  in_RDI[5] = local_10[5];
  in_RDI[6] = local_10[6];
  if (local_10[5] != 0) {
    if (local_10[6] == 0) {
      memcpy(&local_128,"check failed: (that.m_arena.len > 0)",0x25);
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      pcVar1 = (code *)in_RDI[0xb];
      this_00 = &local_128;
      Location::Location(this_00,in_stack_fffffffffffffe38,
                         CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                         CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                         CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
      (*pcVar1)(this_00,0x25,in_RDI[8]);
    }
    basic_substring<char>::basic_substring(local_160);
    local_160[0].str = (char *)(*(code *)in_RDI[9])(local_10[6],local_10[5],in_RDI[8]);
    local_160[0].len = local_10[6];
    next_arena.len = in_stack_000001e8;
    next_arena.str = (char *)this;
    _relocate(that,next_arena);
    in_RDI[5] = (long)local_160[0].str;
    in_RDI[6] = local_160[0].len;
  }
  for (local_178 = 0; local_178 < 4; local_178 = local_178 + 1) {
    memcpy(in_RDI + local_178 * 5 + 0xc,local_10 + local_178 * 5 + 0xc,0x28);
  }
  return;
}

Assistant:

void Tree::_copy(Tree const& that)
{
    _RYML_CB_ASSERT(m_callbacks, m_buf == nullptr);
    _RYML_CB_ASSERT(m_callbacks, m_arena.str == nullptr);
    _RYML_CB_ASSERT(m_callbacks, m_arena.len == 0);
    m_buf = _RYML_CB_ALLOC_HINT(m_callbacks, NodeData, that.m_cap, that.m_buf);
    memcpy(m_buf, that.m_buf, that.m_cap * sizeof(NodeData));
    m_cap = that.m_cap;
    m_size = that.m_size;
    m_free_head = that.m_free_head;
    m_free_tail = that.m_free_tail;
    m_arena_pos = that.m_arena_pos;
    m_arena = that.m_arena;
    if(that.m_arena.str)
    {
        _RYML_CB_ASSERT(m_callbacks, that.m_arena.len > 0);
        substr arena;
        arena.str = _RYML_CB_ALLOC_HINT(m_callbacks, char, that.m_arena.len, that.m_arena.str);
        arena.len = that.m_arena.len;
        _relocate(arena); // does a memcpy of the arena and updates nodes using the old arena
        m_arena = arena;
    }
    for(size_t i = 0; i < RYML_MAX_TAG_DIRECTIVES; ++i)
        m_tag_directives[i] = that.m_tag_directives[i];
}